

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep_io.c
# Opt level: O3

int erkStep_SetOrder(ARKodeMem ark_mem,int ord)

{
  int iVar1;
  int iVar2;
  ARKodeERKStepMem step_mem;
  sunindextype Bliw;
  sunindextype Blrw;
  ARKodeERKStepMem local_40;
  long local_38;
  long local_30;
  
  iVar1 = erkStep_AccessStepMem(ark_mem,"erkStep_SetOrder",&local_40);
  if (iVar1 == 0) {
    iVar2 = 4;
    if (0 < ord) {
      iVar2 = ord;
    }
    local_40->q = iVar2;
    local_40->p = 0;
    local_40->stages = 0;
    ARKodeButcherTable_Space(local_40->B,&local_38,&local_30);
    ARKodeButcherTable_Free(local_40->B);
    local_40->B = (ARKodeButcherTable)0x0;
    ark_mem->liw = ark_mem->liw - local_38;
    ark_mem->lrw = ark_mem->lrw - local_30;
  }
  return iVar1;
}

Assistant:

int erkStep_SetOrder(ARKodeMem ark_mem, int ord)
{
  ARKodeERKStepMem step_mem;
  sunindextype Blrw, Bliw;
  int retval;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* set user-provided value, or default, depending on argument */
  if (ord <= 0) { step_mem->q = Q_DEFAULT; }
  else { step_mem->q = ord; }

  /* clear Butcher tables, since user is requesting a change in method
     or a reset to defaults.  Tables will be set in ARKInitialSetup. */
  step_mem->stages = 0;
  step_mem->p      = 0;

  ARKodeButcherTable_Space(step_mem->B, &Bliw, &Blrw);
  ARKodeButcherTable_Free(step_mem->B);
  step_mem->B = NULL;
  ark_mem->liw -= Bliw;
  ark_mem->lrw -= Blrw;

  return (ARK_SUCCESS);
}